

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_capacity_suite.cpp
# Opt level: O0

void size_suite::test_array(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_108;
  undefined4 local_fc;
  size_type local_f8 [3];
  basic_variable<std::allocator<char>_> *local_e0;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_e0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_e0,1);
  local_e0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_e0,2);
  local_e0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_e0,3);
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_108 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_108 = local_108 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_108);
  } while (local_108 != &local_d8);
  local_f8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                          ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_fc = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_capacity_suite.cpp"
             ,0x145,"void size_suite::test_array()",local_f8,&local_fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array()
{
    variable data = array::make({ 1, 2, 3 });
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 3);
}